

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall SuiteSessionTests::TestCallback::toApp(TestCallback *this)

{
  SessionID *in_RDX;
  Message *in_RSI;
  
  toApp((TestCallback *)&this[-1].factory,in_RSI,in_RDX);
  return;
}

Assistant:

EXCEPT( DoNotSend )
  {
    if(checkForDoNotSend) {
      FIX::Text text;
      if(message.getFieldIfSet(text) && text == "DoNotSend") {
        throw DoNotSend();
      }
    }

    PossDupFlag possDupFlag(false);
    if( message.getHeader().isSetField(possDupFlag) )
      message.getHeader().getField( possDupFlag );
    if( possDupFlag ) 
    {
      resent++;
      lastResent = message;
    }

    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'j':
      toBusinessMessageReject++; break;
    }
  }